

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O3

bsc_step_t
bsc_scatter_single(bsc_step_t depends,bsc_pid_t root,bsc_group_t group,void *src,void *dst,
                  bsc_size_t size)

{
  uint uVar1;
  bsp_pid_t bVar2;
  bsp_pid_t bVar3;
  request_t *prVar4;
  ulong uVar5;
  
  if (group == (bsc_group_t)0x0) {
    uVar1 = bsp_nprocs();
  }
  else {
    uVar1 = *group;
  }
  bVar2 = bsp_pid();
  if (0 < (int)uVar1 && bVar2 == root) {
    uVar5 = 0;
    do {
      if (group == (bsc_group_t)0x0) {
        bVar2 = (bsp_pid_t)uVar5;
      }
      else {
        bVar2 = *(bsp_pid_t *)(*(long *)((long)group + 0x10) + uVar5 * 4);
      }
      bVar3 = bsp_pid();
      prVar4 = new_request(depends);
      prVar4->kind = PUT;
      (prVar4->payload).put.src_addr = src;
      (prVar4->payload).put.dst_addr = dst;
      (prVar4->payload).put.src_pid = bVar3;
      (prVar4->payload).put.dst_pid = bVar2;
      (prVar4->payload).put.size = size;
      (prVar4->payload).put.offset = 0;
      uVar5 = uVar5 + 1;
      src = (void *)((long)src + (long)size);
    } while (uVar1 != uVar5);
  }
  return depends + 1;
}

Assistant:

bsc_step_t bsc_scatter_single( bsc_step_t depends,
                        bsc_pid_t root, bsc_group_t group,
                       const void * src, void *dst, bsc_size_t size )
{
    const group_t * g = group;
    bsc_pid_t i, P = g?g->size:bsp_nprocs() ;
    if ( bsp_pid() == root ) {
        for ( i = 0; i < P; ++i ) {
            bsc_pid_t m = g?g->gid[i]:i;
            const char * src_bytes = src;
            bsc_put( depends, m, src_bytes + i * size, dst, 0, size );
        }
    }
    return depends + 1;
}